

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaVector.cpp
# Opt level: O0

void __thiscall NaVector::NaVector(NaVector *this,uint n)

{
  ulong uVar1;
  void *pvVar2;
  uint in_ESI;
  long *in_RDI;
  
  *in_RDI = (long)&PTR__NaVector_00197ae8;
  *(undefined1 *)(in_RDI + 1) = 1;
  uVar1 = SUB168(ZEXT416(in_ESI) * ZEXT816(8),0);
  if (SUB168(ZEXT416(in_ESI) * ZEXT816(8),8) != 0) {
    uVar1 = 0xffffffffffffffff;
  }
  pvVar2 = operator_new__(uVar1);
  in_RDI[2] = (long)pvVar2;
  *(uint *)((long)in_RDI + 0xc) = in_ESI;
  (**(code **)(*in_RDI + 0x68))();
  return;
}

Assistant:

NaVector::NaVector (unsigned n)
{
    // Create the vector
    bOwnStorage = true;
    pVect = new NaReal[n];
    nDim = n;

    // Initialize items by zero
    init_zero();
}